

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_postfilter.cc
# Opt level: O3

void __thiscall
sptk::MelCepstrumPostfilter::MelCepstrumPostfilter
          (MelCepstrumPostfilter *this,int num_order,int impulse_response_length,int onset_index,
          double alpha,double beta)

{
  bool bVar1;
  
  this->_vptr_MelCepstrumPostfilter = (_func_int **)&PTR__MelCepstrumPostfilter_00112ba8;
  this->onset_index_ = onset_index;
  this->beta_ = beta;
  FrequencyTransform::FrequencyTransform
            (&this->frequency_transform_,num_order,impulse_response_length + -1,-alpha);
  CepstrumToAutocorrelation::CepstrumToAutocorrelation
            (&this->cepstrum_to_autocorrelation_,impulse_response_length + -1,0,
             impulse_response_length);
  MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
            (&this->mel_cepstrum_to_mlsa_digital_filter_coefficients_,num_order,alpha);
  MlsaDigitalFilterCoefficientsToMelCepstrum::MlsaDigitalFilterCoefficientsToMelCepstrum
            (&this->mlsa_digital_filter_coefficients_to_mel_cepstrum_,num_order,alpha);
  this->is_valid_ = true;
  bVar1 = IsInRange(this->onset_index_,0,num_order);
  if ((((!bVar1) || ((this->frequency_transform_).is_valid_ != true)) ||
      ((this->cepstrum_to_autocorrelation_).is_valid_ != true)) ||
     (((this->mel_cepstrum_to_mlsa_digital_filter_coefficients_).is_valid_ != true ||
      ((this->mlsa_digital_filter_coefficients_to_mel_cepstrum_).is_valid_ == false)))) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

MelCepstrumPostfilter::MelCepstrumPostfilter(int num_order,
                                             int impulse_response_length,
                                             int onset_index, double alpha,
                                             double beta)
    : onset_index_(onset_index),
      beta_(beta),
      frequency_transform_(num_order, impulse_response_length - 1, -alpha),
      cepstrum_to_autocorrelation_(impulse_response_length - 1, 0,
                                   impulse_response_length),
      mel_cepstrum_to_mlsa_digital_filter_coefficients_(num_order, alpha),
      mlsa_digital_filter_coefficients_to_mel_cepstrum_(num_order, alpha),
      is_valid_(true) {
  if (!sptk::IsInRange(onset_index_, 0, num_order) ||
      !frequency_transform_.IsValid() ||
      !cepstrum_to_autocorrelation_.IsValid() ||
      !mel_cepstrum_to_mlsa_digital_filter_coefficients_.IsValid() ||
      !mlsa_digital_filter_coefficients_to_mel_cepstrum_.IsValid()) {
    is_valid_ = false;
    return;
  }
}